

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

Norm2AllModes *
icu_63::Norm2AllModes::createInstance(char *packageName,char *name,UErrorCode *errorCode)

{
  UBool UVar1;
  LoadedNormalizer2Impl *this;
  char *size;
  undefined8 local_58;
  LoadedNormalizer2Impl *impl;
  UErrorCode *errorCode_local;
  char *name_local;
  char *packageName_local;
  
  size = name;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (LoadedNormalizer2Impl *)UMemory::operator_new((UMemory *)0x60,(size_t)size);
    local_58 = (LoadedNormalizer2Impl *)0x0;
    if (this != (LoadedNormalizer2Impl *)0x0) {
      LoadedNormalizer2Impl::LoadedNormalizer2Impl(this);
      local_58 = this;
    }
    if (local_58 == (LoadedNormalizer2Impl *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      packageName_local = (char *)0x0;
    }
    else {
      LoadedNormalizer2Impl::load(local_58,packageName,name,errorCode);
      packageName_local = (char *)createInstance(&local_58->super_Normalizer2Impl,errorCode);
    }
  }
  else {
    packageName_local = (char *)0x0;
  }
  return (Norm2AllModes *)packageName_local;
}

Assistant:

Norm2AllModes *
Norm2AllModes::createInstance(const char *packageName,
                              const char *name,
                              UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    LoadedNormalizer2Impl *impl=new LoadedNormalizer2Impl;
    if(impl==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    impl->load(packageName, name, errorCode);
    return createInstance(impl, errorCode);
}